

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEditPrivate::adjustScrollbars(QPlainTextEditPrivate *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  QPlainTextDocumentLayout *pQVar5;
  QPlainTextDocumentLayoutPrivate *pQVar6;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  undefined8 extraout_RDX;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  double dVar10;
  qreal qVar11;
  double in_XMM1_Qa;
  int visualTopLine;
  int lineSpacing;
  int lineNumber;
  int layoutLineCount;
  QTextLayout *layout;
  int visibleFromBottom;
  qreal y;
  qreal visible;
  int vSliderLength;
  qreal margin;
  bool documentSizeChangedBlocked;
  QPlainTextDocumentLayout *documentLayout;
  QTextDocument *doc;
  QPlainTextEdit *q;
  QSizeF documentSize;
  QRectF lr;
  QTextLine line;
  int vmax;
  QTextBlock firstVisibleBlock;
  QTextBlock block;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  QPlainTextEdit *in_stack_fffffffffffffe88;
  QAbstractSlider *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  QScrollBar *pQVar12;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int local_140;
  int local_12c;
  double local_128;
  int local_dc;
  QSizeF local_d8;
  QFontMetrics local_c8 [8];
  int local_c0 [3];
  int local_b4;
  QRectF local_b0;
  undefined1 *local_90;
  undefined1 *local_88;
  QRectF local_80;
  QRect local_5c;
  int local_4c;
  undefined1 *local_48;
  undefined1 *local_40;
  QTextBlock local_38;
  QTextBlock local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QWidgetTextControl::document
            ((QWidgetTextControl *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  QTextDocument::documentLayout();
  pQVar5 = qobject_cast<QPlainTextDocumentLayout*>((QObject *)0x6c2d3f);
  pQVar6 = QPlainTextDocumentLayout::priv
                     ((QPlainTextDocumentLayout *)
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  bVar1 = pQVar6->blockDocumentSizeChanged & 1;
  pQVar6 = QPlainTextDocumentLayout::priv
                     ((QPlainTextDocumentLayout *)
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  pQVar6->blockDocumentSizeChanged = true;
  dVar10 = (double)QTextDocument::documentMargin();
  local_4c = 0;
  if ((((byte)in_RDI->field_0x348 >> 3 & 1) != 0) ||
     (bVar2 = QWidget::isVisible((QWidget *)0x6c2dc6), !bVar2)) {
    local_c0[1] = 0;
    local_c0[0] = QTextDocument::lineCount();
    local_c0[0] = local_c0[0] + -1;
    piVar7 = qMax<int>(local_c0 + 1,local_c0);
    local_4c = *piVar7;
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    in_stack_fffffffffffffeac = QFontMetrics::lineSpacing();
    QFontMetrics::~QFontMetrics(local_c8);
    if (in_stack_fffffffffffffeac == 0) {
      in_stack_fffffffffffffea8 = 0;
    }
    else {
      iVar9 = in_stack_fffffffffffffeac;
      in_stack_fffffffffffffea8 = QWidget::height((QWidget *)0x6c3127);
      in_stack_fffffffffffffea8 = in_stack_fffffffffffffea8 / in_stack_fffffffffffffeac;
      in_stack_fffffffffffffeac = iVar9;
    }
    goto LAB_006c3142;
  }
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::lastBlock();
  local_5c = QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
  ;
  iVar9 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  in_XMM1_Qa = 1.0;
  dVar10 = ((double)iVar9 - dVar10) - 1.0;
  local_128 = 0.0;
  local_12c = 0;
  while (uVar8 = QTextBlock::isValid(), (uVar8 & 1) != 0) {
    uVar8 = QTextBlock::isVisible();
    if ((uVar8 & 1) == 0) {
      QTextBlock::previous();
      QTextBlock::operator=((QTextBlock *)local_18,&local_28);
    }
    else {
      (**(code **)(*(long *)pQVar5 + 0x88))(&local_80,pQVar5,local_18);
      qVar11 = QRectF::height(&local_80);
      local_128 = qVar11 + local_128;
      iVar9 = QTextBlock::layout();
      iVar3 = QTextLayout::lineCount();
      if (dVar10 < local_128) {
        local_140 = 0;
        goto LAB_006c2f24;
      }
      local_12c = iVar3 + local_12c;
      QTextBlock::previous();
      QTextBlock::operator=((QTextBlock *)local_18,&local_38);
    }
  }
  goto LAB_006c3046;
LAB_006c2f24:
  if (iVar3 <= local_140) goto LAB_006c2fef;
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  uVar4 = QTextLayout::lineAt(iVar9);
  local_90 = (undefined1 *)CONCAT44(local_90._4_4_,uVar4);
  local_b0.xp = -NAN;
  local_b0.yp = -NAN;
  local_b0.w = -NAN;
  local_b0.h = -NAN;
  local_88 = (undefined1 *)extraout_RDX;
  QTextLine::naturalTextRect();
  qVar11 = QRectF::top(&local_b0);
  in_XMM1_Qa = local_128 - dVar10;
  if (in_XMM1_Qa <= qVar11) goto LAB_006c2fef;
  local_140 = local_140 + 1;
  goto LAB_006c2f24;
LAB_006c2fef:
  if (local_140 < iVar3) {
    local_12c = (iVar3 - local_140) + local_12c;
  }
LAB_006c3046:
  local_b4 = 0;
  local_c0[2] = QTextDocument::lineCount();
  local_c0[2] = local_c0[2] - local_12c;
  piVar7 = qMax<int>(&local_b4,local_c0 + 2);
  local_4c = *piVar7;
LAB_006c3142:
  local_d8.wd = -NAN;
  local_d8.ht = -NAN;
  local_d8.wd = (qreal)(**(code **)(*(long *)pQVar5 + 0x78))();
  pQVar12 = (in_RDI->super_QAbstractScrollAreaPrivate).vbar;
  local_dc = 0;
  local_d8.ht = in_XMM1_Qa;
  qMax<int>(&local_dc,&local_4c);
  QAbstractSlider::setRange
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
  QAbstractSlider::setPageStep
            ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QPlainTextEdit::firstVisibleBlock(in_stack_fffffffffffffe88);
  uVar8 = QTextBlock::isValid();
  if ((uVar8 & 1) != 0) {
    QTextBlock::firstLineNumber();
  }
  QAbstractSlider::setValue
            ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  qVar11 = QSizeF::width(&local_d8);
  iVar9 = (int)qVar11;
  QWidget::width((QWidget *)0x6c328d);
  QAbstractSlider::setRange(in_stack_fffffffffffffe90,0,in_stack_fffffffffffffe98);
  QWidget::width((QWidget *)0x6c32c0);
  QAbstractSlider::setPageStep
            ((QAbstractSlider *)CONCAT44(iVar9,in_stack_fffffffffffffe80),in_stack_fffffffffffffe7c)
  ;
  pQVar6 = QPlainTextDocumentLayout::priv
                     ((QPlainTextDocumentLayout *)CONCAT44(iVar9,in_stack_fffffffffffffe80));
  pQVar6->blockDocumentSizeChanged = (bool)(bVar1 & 1);
  QAbstractSlider::value((QAbstractSlider *)CONCAT44(iVar9,in_stack_fffffffffffffe80));
  setTopLine((QPlainTextEditPrivate *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (int)((ulong)pQVar12 >> 0x20),(int)pQVar12);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::adjustScrollbars()
{
    Q_Q(QPlainTextEdit);
    QTextDocument *doc = control->document();
    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(doc->documentLayout());
    Q_ASSERT(documentLayout);
    bool documentSizeChangedBlocked = documentLayout->priv()->blockDocumentSizeChanged;
    documentLayout->priv()->blockDocumentSizeChanged = true;
    qreal margin = doc->documentMargin();

    int vmax = 0;

    int vSliderLength = 0;
    if (!centerOnScroll && q->isVisible()) {
        QTextBlock block = doc->lastBlock();
        const qreal visible = viewport->rect().height() - margin - 1;
        qreal y = 0;
        int visibleFromBottom = 0;

        while (block.isValid()) {
            if (!block.isVisible()) {
                block = block.previous();
                continue;
            }
            y += documentLayout->blockBoundingRect(block).height();

            QTextLayout *layout = block.layout();
            int layoutLineCount = layout->lineCount();
            if (y > visible) {
                int lineNumber = 0;
                while (lineNumber < layoutLineCount) {
                    QTextLine line = layout->lineAt(lineNumber);
                    const QRectF lr = line.naturalTextRect();
                    if (lr.top() >= y - visible)
                        break;
                    ++lineNumber;
                }
                if (lineNumber < layoutLineCount)
                    visibleFromBottom += (layoutLineCount - lineNumber);
                break;

            }
            visibleFromBottom += layoutLineCount;
            block = block.previous();
        }
        vmax = qMax(0, doc->lineCount() - visibleFromBottom);
        vSliderLength = visibleFromBottom;

    } else {
        vmax = qMax(0, doc->lineCount() - 1);
        int lineSpacing = q->fontMetrics().lineSpacing();
        vSliderLength = lineSpacing != 0 ? viewport->height() / lineSpacing : 0;
    }

    QSizeF documentSize = documentLayout->documentSize();
    vbar->setRange(0, qMax(0, vmax));
    vbar->setPageStep(vSliderLength);
    int visualTopLine = vmax;
    QTextBlock firstVisibleBlock = q->firstVisibleBlock();
    if (firstVisibleBlock.isValid())
        visualTopLine = firstVisibleBlock.firstLineNumber() + topLine;

    vbar->setValue(visualTopLine);

    hbar->setRange(0, (int)documentSize.width() - viewport->width());
    hbar->setPageStep(viewport->width());
    documentLayout->priv()->blockDocumentSizeChanged = documentSizeChangedBlocked;
    setTopLine(vbar->value());
}